

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void parse_output_model(options_i *options,vw *all)

{
  string *location;
  int iVar1;
  option_group_definition *poVar2;
  ostream *poVar3;
  option_group_definition output_model_options;
  allocator local_e33;
  allocator local_e32;
  allocator local_e31;
  allocator local_e30;
  allocator local_e2f;
  allocator local_e2e;
  allocator local_e2d;
  allocator local_e2c;
  allocator local_e2b;
  allocator local_e2a;
  allocator local_e29;
  allocator local_e28;
  allocator local_e27;
  allocator local_e26;
  allocator local_e25;
  allocator local_e24;
  allocator local_e23;
  allocator local_e22;
  allocator local_e21;
  string local_e20 [32];
  string local_e00;
  string local_de0 [32];
  string local_dc0;
  string local_da0 [32];
  string local_d80;
  string local_d60 [32];
  string local_d40;
  string local_d20 [32];
  string local_d00;
  string local_ce0 [32];
  string local_cc0;
  string local_ca0 [32];
  string local_c80;
  string local_c60 [32];
  string local_c40;
  string local_c20 [32];
  string local_c00 [32];
  string local_be0;
  string local_bc0;
  option_group_definition local_ba0;
  undefined1 local_b68 [80];
  string local_b18 [80];
  undefined1 local_ac8 [160];
  undefined1 local_a28 [160];
  undefined1 local_988 [160];
  undefined1 local_8e8 [160];
  undefined1 local_848 [160];
  undefined1 local_7a8 [160];
  undefined1 local_708 [160];
  undefined1 local_668 [160];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_528;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_488;
  typed_option<bool> local_3e8;
  typed_option<bool> local_348;
  typed_option<bool> local_2a8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  
  std::__cxx11::string::string((string *)&local_bc0,"Output model",(allocator *)local_b68);
  VW::config::option_group_definition::option_group_definition(&local_ba0,&local_bc0);
  std::__cxx11::string::~string((string *)&local_bc0);
  std::__cxx11::string::string((string *)&local_be0,"final_regressor",&local_e21);
  location = &all->final_regressor_name;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b68,&local_be0,location);
  std::__cxx11::string::string(local_c00,"f",&local_e22);
  std::__cxx11::string::_M_assign(local_b18);
  std::__cxx11::string::string(local_c20,"Final regressor",&local_e23);
  std::__cxx11::string::_M_assign((string *)(local_b68 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_c8,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b68);
  poVar2 = VW::config::option_group_definition::add<std::__cxx11::string>(&local_ba0,&local_c8);
  std::__cxx11::string::string((string *)&local_c40,"readable_model",&local_e24);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_ac8,&local_c40,&all->text_regressor_name);
  std::__cxx11::string::string
            (local_c60,"Output human-readable final regressor with numeric features",&local_e25);
  std::__cxx11::string::_M_assign((string *)(local_ac8 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_168,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_ac8);
  poVar2 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar2,&local_168);
  std::__cxx11::string::string((string *)&local_c80,"invert_hash",&local_e26);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_668,&local_c80,&all->inv_hash_regressor_name);
  std::__cxx11::string::string
            (local_ca0,
             "Output human-readable final regressor with feature names.  Computationally expensive."
             ,&local_e27);
  std::__cxx11::string::_M_assign((string *)(local_668 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_208,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_668);
  poVar2 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar2,&local_208);
  std::__cxx11::string::string((string *)&local_cc0,"save_resume",&local_e28);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_708,&local_cc0,&all->save_resume);
  std::__cxx11::string::string
            (local_ce0,"save extra state so learning can be resumed later with new data",&local_e29)
  ;
  std::__cxx11::string::_M_assign((string *)(local_708 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2a8,(typed_option<bool> *)local_708);
  poVar2 = VW::config::option_group_definition::add<bool>(poVar2,&local_2a8);
  std::__cxx11::string::string((string *)&local_d00,"preserve_performance_counters",&local_e2a);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_7a8,&local_d00,&all->preserve_performance_counters);
  std::__cxx11::string::string(local_d20,"reset performance counters when warmstarting",&local_e2b);
  std::__cxx11::string::_M_assign((string *)(local_7a8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_348,(typed_option<bool> *)local_7a8);
  poVar2 = VW::config::option_group_definition::add<bool>(poVar2,&local_348);
  std::__cxx11::string::string((string *)&local_d40,"save_per_pass",&local_e2c);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_848,&local_d40,&all->save_per_pass);
  std::__cxx11::string::string(local_d60,"Save the model after every pass over data",&local_e2d);
  std::__cxx11::string::_M_assign((string *)(local_848 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_3e8,(typed_option<bool> *)local_848);
  poVar2 = VW::config::option_group_definition::add<bool>(poVar2,&local_3e8);
  std::__cxx11::string::string((string *)&local_d80,"output_feature_regularizer_binary",&local_e2e);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_8e8,&local_d80,&all->per_feature_regularizer_output);
  std::__cxx11::string::string(local_da0,"Per feature regularization output file",&local_e2f);
  std::__cxx11::string::_M_assign((string *)(local_8e8 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_488,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_8e8);
  poVar2 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar2,&local_488);
  std::__cxx11::string::string((string *)&local_dc0,"output_feature_regularizer_text",&local_e30);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_988,&local_dc0,&all->per_feature_regularizer_text);
  std::__cxx11::string::string
            (local_de0,"Per feature regularization output file, in text",&local_e31);
  std::__cxx11::string::_M_assign((string *)(local_988 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_528,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_988);
  poVar2 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar2,&local_528);
  std::__cxx11::string::string((string *)&local_e00,"id",&local_e32);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_a28,&local_e00,&all->id);
  std::__cxx11::string::string
            (local_e20,"User supplied ID embedded into the final regressor",&local_e33);
  std::__cxx11::string::_M_assign((string *)(local_a28 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_5c8,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_a28);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar2,&local_5c8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_5c8);
  std::__cxx11::string::~string(local_e20);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_a28);
  std::__cxx11::string::~string((string *)&local_e00);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_528);
  std::__cxx11::string::~string(local_de0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_988);
  std::__cxx11::string::~string((string *)&local_dc0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_488);
  std::__cxx11::string::~string(local_da0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_8e8);
  std::__cxx11::string::~string((string *)&local_d80);
  VW::config::typed_option<bool>::~typed_option(&local_3e8);
  std::__cxx11::string::~string(local_d60);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_848);
  std::__cxx11::string::~string((string *)&local_d40);
  VW::config::typed_option<bool>::~typed_option(&local_348);
  std::__cxx11::string::~string(local_d20);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_7a8);
  std::__cxx11::string::~string((string *)&local_d00);
  VW::config::typed_option<bool>::~typed_option(&local_2a8);
  std::__cxx11::string::~string(local_ce0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_708);
  std::__cxx11::string::~string((string *)&local_cc0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_208);
  std::__cxx11::string::~string(local_ca0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_668);
  std::__cxx11::string::~string((string *)&local_c80);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_168);
  std::__cxx11::string::~string(local_c60);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_ac8);
  std::__cxx11::string::~string((string *)&local_c40);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_c8);
  std::__cxx11::string::~string(local_c20);
  std::__cxx11::string::~string(local_c00);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_b68);
  std::__cxx11::string::~string((string *)&local_be0);
  (**options->_vptr_options_i)(options,&local_ba0);
  iVar1 = std::__cxx11::string::compare((char *)location);
  if ((iVar1 != 0) && (all->quiet == false)) {
    poVar3 = std::operator<<(&(all->trace_message).super_ostream,"final_regressor = ");
    poVar3 = std::operator<<(poVar3,(string *)location);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__cxx11::string::string((string *)local_b68,"invert_hash",(allocator *)local_ac8);
  iVar1 = (*options->_vptr_options_i[1])(options,local_b68);
  std::__cxx11::string::~string((string *)local_b68);
  if ((char)iVar1 != '\0') {
    all->hash_inv = true;
  }
  VW::config::option_group_definition::~option_group_definition(&local_ba0);
  return;
}

Assistant:

void parse_output_model(options_i& options, vw& all)
{
  option_group_definition output_model_options("Output model");
  output_model_options
      .add(make_option("final_regressor", all.final_regressor_name).short_name("f").help("Final regressor"))
      .add(make_option("readable_model", all.text_regressor_name)
               .help("Output human-readable final regressor with numeric features"))
      .add(make_option("invert_hash", all.inv_hash_regressor_name)
               .help("Output human-readable final regressor with feature names.  Computationally expensive."))
      .add(make_option("save_resume", all.save_resume)
               .help("save extra state so learning can be resumed later with new data"))
      .add(make_option("preserve_performance_counters", all.preserve_performance_counters)
               .help("reset performance counters when warmstarting"))
      .add(make_option("save_per_pass", all.save_per_pass).help("Save the model after every pass over data"))
      .add(make_option("output_feature_regularizer_binary", all.per_feature_regularizer_output)
               .help("Per feature regularization output file"))
      .add(make_option("output_feature_regularizer_text", all.per_feature_regularizer_text)
               .help("Per feature regularization output file, in text"))
      .add(make_option("id", all.id).help("User supplied ID embedded into the final regressor"));
  options.add_and_parse(output_model_options);

  if (all.final_regressor_name.compare("") && !all.quiet)
    all.trace_message << "final_regressor = " << all.final_regressor_name << endl;

  if (options.was_supplied("invert_hash"))
    all.hash_inv = true;

  // Question: This doesn't seem necessary
  // if (options.was_supplied("id") && find(arg.args.begin(), arg.args.end(), "--id") == arg.args.end())
  // {
  //   arg.args.push_back("--id");
  //   arg.args.push_back(arg.vm["id"].as<string>());
  // }
}